

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void __thiscall wasm_exporttype_t::wasm_exporttype_t(wasm_exporttype_t *this,ExportType *et)

{
  pointer pcVar1;
  _Head_base<0UL,_wabt::interp::ExternType_*,_false> local_20;
  
  wabt::interp::ExportType::ExportType(&this->I,et);
  (*((et->type)._M_t.
     super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
     ._M_t.
     super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
     .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->_vptr_ExternType[2])
            (&local_20);
  wasm_externtype_t::New
            ((wasm_externtype_t *)&this->extern_,
             (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> *
             )&local_20);
  if (local_20._M_head_impl != (ExternType *)0x0) {
    (*(local_20._M_head_impl)->_vptr_ExternType[1])();
  }
  pcVar1 = (this->I).name._M_dataplus._M_p;
  (this->name).size = (this->I).name._M_string_length;
  (this->name).data = pcVar1;
  return;
}

Assistant:

wasm_exporttype_t(ExportType et)
      : I(et),
        extern_{wasm_externtype_t::New(et.type->Clone())},
        name{I.name.size(), const_cast<wasm_byte_t*>(I.name.data())} {}